

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.c
# Opt level: O0

int lws_http_cookie_get(lws *wsi,char *name,char *buf,size_t *max_len)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  size_t __n;
  char *pcVar4;
  bool bVar5;
  bool bVar6;
  size_t local_60;
  size_t fl;
  int f;
  int n;
  char *bo;
  char *p;
  size_t bl;
  size_t max;
  size_t *max_len_local;
  char *buf_local;
  char *name_local;
  lws *wsi_local;
  
  bl = *max_len;
  __n = strlen(name);
  uVar2 = lws_hdr_total_length(wsi,WSI_TOKEN_HTTP_COOKIE);
  if ((ulong)uVar2 < __n + 1) {
    wsi_local._4_4_ = 1;
  }
  else {
    iVar3 = lws_hdr_total_length(wsi,WSI_TOKEN_HTTP_COLON_METHOD);
    if (iVar3 == 0) {
      pcVar4 = lws_hdr_simple_ptr(wsi,WSI_TOKEN_HTTP_COOKIE);
      if (pcVar4 == (char *)0x0) {
        wsi_local._4_4_ = 1;
      }
      else {
        bo = pcVar4 + __n;
        fl._4_4_ = uVar2 - (int)__n;
        while (iVar3 = fl._4_4_ + -1, (int)__n < fl._4_4_) {
          fl._4_4_ = iVar3;
          if ((*bo == '=') &&
             (iVar3 = memcmp(bo + -__n,name,__n & 0xffffffff), max_len_local = (size_t *)buf,
             iVar3 == 0)) {
            while( true ) {
              bo = bo + 1;
              bVar6 = false;
              if (*bo != ';') {
                iVar3 = fl._4_4_ + -1;
                bVar5 = fl._4_4_ != 0;
                bVar6 = false;
                fl._4_4_ = iVar3;
                if (bVar5) {
                  bVar6 = bl != 0;
                }
              }
              if (!bVar6) break;
              *(char *)max_len_local = *bo;
              bl = bl - 1;
              max_len_local = (size_t *)((long)max_len_local + 1);
            }
            if (bl == 0) {
              return 2;
            }
            *(undefined1 *)max_len_local = 0;
            *max_len = (long)max_len_local - (long)buf;
            return 0;
          }
          bo = bo + 1;
        }
        wsi_local._4_4_ = 1;
      }
    }
    else {
      bVar1 = ((wsi->http).ah)->frag_index[0x1a];
      while (fl._0_4_ = (uint)bVar1, (uint)fl != 0) {
        pcVar4 = ((wsi->http).ah)->data + ((wsi->http).ah)->frags[(int)(uint)fl].offset;
        local_60 = (size_t)((wsi->http).ah)->frags[(int)(uint)fl].len;
        if (((__n + 1 <= local_60) && (pcVar4[__n] == '=')) &&
           (iVar3 = memcmp(pcVar4,name,__n), iVar3 == 0)) {
          local_60 = local_60 - (__n + 1);
          if (bl - 1 < local_60) {
            local_60 = bl - 1;
          }
          if (local_60 != 0) {
            memcpy(buf,pcVar4 + __n + 1,local_60);
          }
          *max_len = local_60;
          buf[local_60] = '\0';
          return 0;
        }
        bVar1 = ((wsi->http).ah)->frags[(int)(uint)fl].nfrag;
      }
      wsi_local._4_4_ = -1;
    }
  }
  return wsi_local._4_4_;
}

Assistant:

int
lws_http_cookie_get(struct lws *wsi, const char *name, char *buf,
		    size_t *max_len)
{
	size_t max = *max_len, bl = strlen(name);
	char *p, *bo = buf;
	int n;

	n = lws_hdr_total_length(wsi, WSI_TOKEN_HTTP_COOKIE);
	if ((unsigned int)n < bl + 1)
		return 1;

	/*
	 * This can come to us two ways, in ah fragments (h2) or as a single
	 * semicolon-delimited string (h1)
	 */

#if defined(LWS_ROLE_H2)
	if (lws_hdr_total_length(wsi, WSI_TOKEN_HTTP_COLON_METHOD)) {

		/*
		 * The h2 way...
		 */

		int f = wsi->http.ah->frag_index[WSI_TOKEN_HTTP_COOKIE];
		size_t fl;

		while (f) {
			p = wsi->http.ah->data + wsi->http.ah->frags[f].offset;
			fl = (size_t)wsi->http.ah->frags[f].len;
			if (fl >= bl + 1 &&
			    p[bl] == '=' &&
			    !memcmp(p, name, bl)) {
				fl -= bl + 1;
				if (max - 1 < fl)
					fl = max - 1;
				if (fl)
					memcpy(buf, p + bl + 1, fl);
				*max_len = fl;
				buf[fl] = '\0';

				return 0;
			}
			f = wsi->http.ah->frags[f].nfrag;
		}

		return -1;
	}
#endif

	/*
	 * The h1 way...
	 */

	p = lws_hdr_simple_ptr(wsi, WSI_TOKEN_HTTP_COOKIE);
	if (!p)
		return 1;

	p += bl;
	n -= (int)bl;
	while (n-- > (int)bl) {
		if (*p == '=' && !memcmp(p - bl, name, (unsigned int)bl)) {
			p++;
			while (*p != ';' && n-- && max) {
				*buf++ = *p++;
				max--;
			}
			if (!max)
				return 2;

			*buf = '\0';
			*max_len = lws_ptr_diff_size_t(buf, bo);

			return 0;
		}
		p++;
	}

	return 1;
}